

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

void unprepare_permutation_ntk(saucy *s)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Nm_Man_t *pNVar3;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  char *pName;
  int i;
  Vec_Ptr_t *p;
  long lVar4;
  
  iVar1 = s->pNtk->vPos->nSize;
  Nm_ManFree(s->pNtk_permuted->pManName);
  pAVar2 = s->pNtk;
  pNVar3 = Nm_ManCreate(pAVar2->vCos->nSize + pAVar2->vCis->nSize + pAVar2->vBoxes->nSize);
  s->pNtk_permuted->pManName = pNVar3;
  for (lVar4 = 0; lVar4 < s->n; lVar4 = lVar4 + 1) {
    i = (int)lVar4;
    if (lVar4 < iVar1) {
      pObj = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk->vPos,s->gamma[lVar4]);
      p = s->pNtk_permuted->vPos;
    }
    else {
      pObj = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk->vPis,s->gamma[lVar4] - iVar1);
      p = s->pNtk_permuted->vPis;
      i = i - iVar1;
    }
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(p,i);
    pName = Abc_ObjName(pObj);
    Abc_ObjAssignName(pObj_00,pName,(char *)0x0);
  }
  Abc_NtkOrderObjsByName(s->pNtk_permuted,1);
  return;
}

Assistant:

void
unprepare_permutation_ntk(struct saucy *s) 
{       
    int i;
    Abc_Obj_t * pObj, * pObjPerm;
    int numouts = Abc_NtkPoNum(s->pNtk);

    Nm_ManFree( s->pNtk_permuted->pManName );
    s->pNtk_permuted->pManName = Nm_ManCreate( Abc_NtkCiNum(s->pNtk) + Abc_NtkCoNum(s->pNtk) + Abc_NtkBoxNum(s->pNtk) );    

    for (i = 0; i < s->n; ++i) {        
        if (i < numouts) {
            pObj     = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk->vPos, s->gamma[i]);
            pObjPerm = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk_permuted->vPos, i);         
        }
        else {          
            pObj     = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk->vPis, s->gamma[i] - numouts);
            pObjPerm = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk_permuted->vPis, i - numouts);
            
        }
        Abc_ObjAssignName( pObjPerm, Abc_ObjName(pObj), NULL );         
    }

    Abc_NtkOrderObjsByName( s->pNtk_permuted, 1 );
}